

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_delimit_enum_flags(flatcc_json_printer_t *ctx,int multiple)

{
  bool local_19;
  int quote;
  int multiple_local;
  flatcc_json_printer_t *ctx_local;
  
  local_19 = ctx->unquote == '\0' || multiple != 0;
  *ctx->p = '\"';
  ctx->p = ctx->p + (int)(uint)local_19;
  return;
}

Assistant:

void flatcc_json_printer_delimit_enum_flags(flatcc_json_printer_t *ctx, int multiple)
{
#if FLATCC_JSON_PRINT_ALWAYS_QUOTE_MULTIPLE_FLAGS
    int quote = !ctx->unquote || multiple;
#else
    int quote = !ctx->unquote;
#endif
    *ctx->p = '"';
    ctx->p += quote;
}